

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isValidURI(bool haveBaseURI,XMLCh *uriStr,bool bAllowSpaces)

{
  short *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  undefined7 in_register_00000039;
  XMLCh *toSearch;
  long lVar10;
  ulong uVar11;
  XMLSize_t local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  do {
    toSearch = uriStr;
    uriStr = toSearch + 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*toSearch] < '\0');
  lVar10 = 0;
  do {
    psVar1 = (short *)((long)toSearch + lVar10);
    lVar10 = lVar10 + 2;
  } while (*psVar1 != 0);
  uVar11 = lVar10 >> 1;
  do {
    if (uVar11 == 1) {
      return haveBaseURI;
    }
    lVar10 = uVar11 - 2;
    uVar11 = uVar11 - 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toSearch[lVar10]] < '\0');
  local_38 = (undefined4)CONCAT71(in_register_00000011,bAllowSpaces);
  local_34 = (undefined4)CONCAT71(in_register_00000039,haveBaseURI);
  local_40 = 0;
  iVar4 = XMLString::indexOf(toSearch,L':');
  iVar5 = XMLString::indexOf(toSearch,L'/');
  iVar6 = XMLString::indexOf(toSearch,L'?');
  iVar7 = XMLString::indexOf(toSearch,L'#');
  if ((((iVar4 < 1) || (iVar5 < iVar4 && iVar5 != -1)) || (iVar6 < iVar4 && iVar6 != -1)) ||
     (iVar7 != -1 && iVar7 < iVar4)) {
    bVar3 = false;
    if ((iVar4 != 0 & (iVar7 == 0 | (byte)local_34)) == 0) {
      return false;
    }
  }
  else {
    bVar3 = processScheme(toSearch,&local_40);
    if (!bVar3) {
      return false;
    }
    local_40 = local_40 + 1;
    bVar3 = true;
  }
  if ((local_40 != uVar11) && ((bVar3 == false || (toSearch[local_40] != L'#')))) {
    if ((local_40 + 1 < uVar11) &&
       (iVar4 = XMLString::compareNString(toSearch + local_40,L"//",2), iVar4 == 0)) {
      uVar8 = local_40 + 2;
      local_40 = uVar8;
      uVar9 = uVar8;
      while ((uVar9 < uVar11 &&
             ((0x3f < (ulong)(ushort)toSearch[uVar9] ||
              (local_40 = uVar9,
              (0x8000800800000000U >> ((ulong)(ushort)toSearch[uVar9] & 0x3f) & 1) == 0))))) {
        uVar9 = uVar9 + 1;
        local_40 = uVar11;
      }
      if ((uVar8 <= local_40 && local_40 - uVar8 != 0) &&
         (bVar2 = processAuthority(toSearch + uVar8,local_40 - uVar8), !bVar2)) {
        return false;
      }
    }
    if (local_40 < uVar11) {
      bVar3 = processPath(toSearch + local_40,uVar11 - local_40,bVar3,local_38._0_1_);
      if (!bVar3) {
        return false;
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool XMLUri::isValidURI(bool haveBaseURI, const XMLCh* const uriStr, bool bAllowSpaces/*=false*/)
{
    // get a trimmed version of uriStr
    // uriStr will NO LONGER be used in this function.
    const XMLCh* trimmedUriSpec = uriStr;

    while (XMLChar1_0::isWhitespace(*trimmedUriSpec))
        trimmedUriSpec++;

    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    while (trimmedUriSpecLen) {
        if (XMLChar1_0::isWhitespace(trimmedUriSpec[trimmedUriSpecLen-1]))
            trimmedUriSpecLen--;
        else
            break;
    }

    if (trimmedUriSpecLen == 0)
    {
        if (!haveBaseURI)
            return false;
        return true;
    }

    XMLSize_t index = 0;
    bool foundScheme = false;

    // Check for scheme, which must be before `/', '?' or '#'.
    int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
    int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
    int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
    int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

    if ((colonIdx <= 0) ||
        (colonIdx > slashIdx && slashIdx != -1) ||
        (colonIdx > queryIdx && queryIdx != -1) ||
        (colonIdx > fragmentIdx && fragmentIdx != -1))
    {
        // A standalone base is a valid URI according to spec
        if (colonIdx == 0 || (!haveBaseURI && fragmentIdx != 0))
            return false;
    }
    else
    {
        if (!processScheme(trimmedUriSpec, index))
            return false;
        foundScheme = true;
        ++index;
    }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
        return false;

	// two slashes means generic URI syntax, so we get the authority
    const XMLCh* authUriSpec = trimmedUriSpec +  index;
    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            if (!processAuthority(trimmedUriSpec + startPos, index - startPos))
                return false;
        }
    }

    // we need to check if index has exceed the length or not
    if (index < trimmedUriSpecLen)
    {
        if (!processPath(trimmedUriSpec + index, trimmedUriSpecLen - index, foundScheme, bAllowSpaces))
            return false;
    }

    return true;
}